

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-hash.h
# Opt level: O3

uint64_t mir_hash_strict(void *key,size_t len,uint64_t seed)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  uVar8 = seed + len;
  if (0xf < len) {
    auVar3 = vpmovsxdq_avx(ZEXT816(0x288eea2165862b62));
    auVar4 = vpmovzxdq_avx(ZEXT816(0x6831e6a7bdf5ef4d));
    do {
      auVar2 = *key;
      len = len - 0x10;
      key = (void *)((long)key + 0x10);
      auVar11 = vpsrlq_avx(auVar2,0x20);
      auVar5 = vpmuludq_avx(auVar2,auVar3);
      auVar12 = vpmuludq_avx(auVar2,auVar4);
      auVar2 = vpmuludq_avx(auVar11,auVar4);
      auVar11 = vpmuludq_avx(auVar11,auVar3);
      auVar2 = vpaddq_avx(auVar5,auVar2);
      auVar5 = vpaddq_avx(auVar12,auVar11);
      auVar11 = vpsrlq_avx(auVar2,0x20);
      auVar12 = vpsllq_avx(auVar2,0x20);
      auVar2 = vpaddq_avx(auVar5,auVar11);
      auVar2 = vpaddq_avx(auVar2,auVar12);
      uVar9 = vpextrq_avx(auVar2,1);
      uVar9 = uVar9 ^ auVar2._0_8_ ^ uVar8;
      uVar8 = (uVar9 >> 0x20) * 0xbdf5ef4d + (uVar9 & 0xffffffff) * 0x65862b62;
      uVar8 = (uVar8 << 0x20) +
              (uVar9 & 0xffffffff) * 0xbdf5ef4d + (uVar9 >> 0x20) * 0x65862b62 + (uVar8 >> 0x20) ^
              uVar9;
    } while (0xf < len);
  }
  if (7 < len) {
    puVar6 = *(undefined1 (*) [16])key;
    len = len - 8;
    key = *(undefined1 (*) [16])key + 8;
    uVar10 = *(ulong *)puVar6 & 0xffffffff;
    uVar9 = *(ulong *)puVar6 >> 0x20;
    uVar7 = uVar9 * 0xbdf5ef4d + uVar10 * 0x65862b62;
    uVar8 = uVar8 ^ (uVar7 << 0x20) + uVar10 * 0xbdf5ef4d + uVar9 * 0x65862b62 + (uVar7 >> 0x20);
  }
  if (len != 0) {
    if (len < 4) {
      uVar7 = 0;
      uVar9 = 0;
    }
    else {
      uVar7 = 4;
      uVar9 = (ulong)*(uint *)*(undefined1 (*) [16])key << 0x20;
    }
    if (uVar7 < len) {
      do {
        pbVar1 = *(undefined1 (*) [16])key + uVar7;
        uVar7 = uVar7 + 1;
        uVar9 = uVar9 >> 8 | (ulong)*pbVar1 << 0x38;
      } while (len != uVar7);
    }
    uVar7 = (uVar9 >> 0x20) * 0x6831e6a7 + (uVar9 & 0xffffffff) * 0x288eea21;
    uVar8 = uVar8 ^ (uVar7 << 0x20) +
                    (uVar9 & 0xffffffff) * 0x6831e6a7 + (uVar9 >> 0x20) * 0x288eea21 +
                    (uVar7 >> 0x20);
  }
  uVar9 = (uVar8 >> 0x20) * 0xbdf5ef4d + (uVar8 & 0xffffffff) * 0x65862b62;
  uVar8 = (uVar9 << 0x20) +
          (uVar8 & 0xffffffff) * 0xbdf5ef4d + (uVar8 >> 0x20) * 0x65862b62 + (uVar9 >> 0x20) ^ uVar8
  ;
  uVar9 = (uVar8 >> 0x20) * 0x6831e6a7 + (uVar8 & 0xffffffff) * 0x288eea21;
  return (uVar9 << 0x20) +
         (uVar8 & 0xffffffff) * 0x6831e6a7 + (uVar8 >> 0x20) * 0x288eea21 + (uVar9 >> 0x20) ^ uVar8;
}

Assistant:

static inline uint64_t mir_hash_strict (const void *key, size_t len, uint64_t seed) {
  return mir_hash_1 (key, len, seed, 0);
}